

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.h
# Opt level: O0

void __thiscall HEkk::HEkk(HEkk *this)

{
  undefined8 *in_RDI;
  HighsLp *in_stack_00000010;
  HighsSimplexInfo *in_stack_00000030;
  HighsSimplexAnalysis *in_stack_00000040;
  undefined8 in_stack_ffffffffffffff88;
  HighsUInt seed;
  HighsRandom *in_stack_ffffffffffffff90;
  HotStart *this_00;
  HighsHashTable<unsigned_long,_void> *in_stack_ffffffffffffffa0;
  HSimplexNla *this_01;
  SimplexBasis *this_02;
  allocator local_15 [21];
  
  seed = (HighsUInt)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  HighsSimplexAnalysis::HighsSimplexAnalysis(in_stack_00000040);
  HighsLp::HighsLp(in_stack_00000010);
  this_02 = (SimplexBasis *)(in_RDI + 0x4a6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_02,"",local_15);
  std::allocator<char>::~allocator((allocator<char> *)local_15);
  HighsSimplexStatus::HighsSimplexStatus((HighsSimplexStatus *)(in_RDI + 0x4aa));
  HighsSimplexInfo::HighsSimplexInfo(in_stack_00000030);
  *(undefined4 *)(in_RDI + 0x52e) = 0;
  this_01 = (HSimplexNla *)(in_RDI + 0x52f);
  SimplexBasis::SimplexBasis(this_02);
  HighsHashTable<unsigned_long,_void>::HighsHashTable(in_stack_ffffffffffffffa0);
  HighsRandom::HighsRandom(in_stack_ffffffffffffff90,seed);
  this_00 = (HotStart *)(in_RDI + 0x544);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b6bf);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b6d5);
  *(undefined1 *)(in_RDI + 0x54a) = 0;
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)this_02);
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)this_02);
  HSimplexNla::HSimplexNla(this_01);
  HotStart::HotStart(this_00);
  in_RDI[0x6dc] = 0x3ff0000000000000;
  in_RDI[0x6dd] = 0;
  in_RDI[0x6de] = 0;
  *(undefined4 *)(in_RDI + 0x6df) = 0;
  *(undefined4 *)((long)in_RDI + 0x36fc) = 0;
  *(undefined4 *)(in_RDI + 0x6e0) = 0;
  *(undefined4 *)((long)in_RDI + 0x3704) = 0x80000001;
  *(undefined1 *)(in_RDI + 0x6e1) = 0;
  *(undefined1 *)((long)in_RDI + 0x3709) = 0;
  *(undefined4 *)((long)in_RDI + 0x370c) = 0;
  *(undefined4 *)(in_RDI + 0x6e2) = 0;
  *(undefined4 *)((long)in_RDI + 0x3714) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b7ba);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b7cb);
  HighsRayRecord::HighsRayRecord((HighsRayRecord *)0x49b7dc);
  HighsRayRecord::HighsRayRecord((HighsRayRecord *)0x49b7ed);
  *(undefined4 *)(in_RDI + 0x6f1) = 0;
  *(undefined4 *)((long)in_RDI + 0x378c) = 0;
  *(undefined4 *)(in_RDI + 0x6f2) = 0;
  in_RDI[0x6f3] = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b827);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b838);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b849);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b85a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b86b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b87c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b88d);
  in_RDI[0x709] = 0;
  in_RDI[0x70a] = 0;
  in_RDI[0x70b] = 0;
  *(undefined4 *)(in_RDI + 0x70c) = 0;
  *(undefined4 *)((long)in_RDI + 0x3864) = 0;
  *(undefined1 *)(in_RDI + 0x70d) = 0;
  *(undefined4 *)((long)in_RDI + 0x386c) = 0;
  *(undefined1 *)(in_RDI + 0x70e) = 0;
  *(undefined1 *)((long)in_RDI + 0x3871) = 0;
  *(undefined1 *)((long)in_RDI + 0x3872) = 0;
  *(undefined1 *)((long)in_RDI + 0x3873) = 0;
  in_RDI[0x70f] = 0;
  std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>::
  vector((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
          *)0x49b90b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b91c);
  return;
}

Assistant:

HEkk()
      : callback_(nullptr),
        options_(nullptr),
        timer_(nullptr),
        lp_name_(""),
        model_status_(HighsModelStatus::kNotset),
        simplex_in_scaled_space_(false),
        cost_scale_(1.0),
        cost_perturbation_base_(0.0),
        cost_perturbation_max_abs_cost_(0.0),
        iteration_count_(0),
        dual_simplex_cleanup_level_(0),
        dual_simplex_phase1_cleanup_level_(0),
        previous_iteration_cycling_detected(-kHighsIInf),
        solve_bailout_(false),
        called_return_from_solve_(false),
        exit_algorithm_(SimplexAlgorithm::kNone),
        return_primal_solution_status_(0),
        return_dual_solution_status_(0),
        original_num_col_(0),
        original_num_row_(0),
        original_num_nz_(0),
        original_offset_(0.0),
        edge_weight_error_(0.0),
        build_synthetic_tick_(0.0),
        total_synthetic_tick_(0.0),
        debug_solve_call_num_(0),
        debug_basis_id_(0),
        time_report_(false),
        debug_initial_build_synthetic_tick_(0),
        debug_solve_report_(false),
        debug_iteration_report_(false),
        debug_basis_report_(false),
        debug_dual_feasible(false),
        debug_max_relative_dual_steepest_edge_weight_error(0) {}